

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.cpp
# Opt level: O3

void macro_AppendArg(MacroArgs **argPtr,char *s)

{
  uint uVar1;
  uint uVar2;
  MacroArgs *__ptr;
  int *piVar3;
  char *pcVar4;
  
  if (*s == '\0') {
    warning(WARNING_EMPTY_MACRO_ARG,"Empty macro argument\n");
  }
  __ptr = *argPtr;
  uVar1 = __ptr->nbArgs;
  if (uVar1 == 99999) {
    error("A maximum of 99999 arguments is allowed\n");
    __ptr = *argPtr;
    uVar1 = __ptr->nbArgs;
  }
  if (__ptr->capacity <= uVar1) {
    uVar2 = __ptr->capacity * 2;
    __ptr->capacity = uVar2;
    if (uVar2 <= uVar1) {
      fatalerror("Failed to add new macro argument: capacity overflow\n");
    }
    __ptr = (MacroArgs *)realloc(__ptr,(ulong)uVar2 * 8 + 0x10);
    *argPtr = __ptr;
    if (__ptr == (MacroArgs *)0x0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fatalerror("Error adding new macro argument: %s\n",pcVar4);
    }
    uVar1 = __ptr->nbArgs;
  }
  __ptr->nbArgs = uVar1 + 1;
  *(char **)(&__ptr[1].nbArgs + (ulong)uVar1 * 2) = s;
  return;
}

Assistant:

void macro_AppendArg(struct MacroArgs **argPtr, char *s)
{
#define macArgs (*argPtr)
	if (s[0] == '\0')
		warning(WARNING_EMPTY_MACRO_ARG, "Empty macro argument\n");
	if (macArgs->nbArgs == MAXMACROARGS)
		error("A maximum of " EXPAND_AND_STR(MAXMACROARGS) " arguments is allowed\n");
	if (macArgs->nbArgs >= macArgs->capacity) {
		macArgs->capacity *= 2;
		// Check that overflow didn't roll us back
		if (macArgs->capacity <= macArgs->nbArgs)
			fatalerror("Failed to add new macro argument: capacity overflow\n");
		macArgs = (struct MacroArgs *)realloc(macArgs, SIZEOF_ARGS(macArgs->capacity));
		if (!macArgs)
			fatalerror("Error adding new macro argument: %s\n", strerror(errno));
	}
	macArgs->args[macArgs->nbArgs++] = s;
#undef macArgs
}